

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O0

Gia_Man_t * Bmc_ChainCleanup(Gia_Man_t *p,Vec_Int_t *vOutputs)

{
  int iVar1;
  Gia_Obj_t *pObj_00;
  Gia_Man_t *pGVar2;
  Gia_Obj_t *pObj;
  int iOut;
  int i;
  Vec_Int_t *vOutputs_local;
  Gia_Man_t *p_local;
  
  pObj._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vOutputs);
    if (iVar1 <= pObj._4_4_) {
      pGVar2 = Gia_ManCleanup(p);
      return pGVar2;
    }
    iVar1 = Vec_IntEntry(vOutputs,pObj._4_4_);
    pObj_00 = Gia_ManPo(p,iVar1);
    iVar1 = Gia_ObjFaninLit0p(p,pObj_00);
    if (iVar1 == 0) break;
    Gia_ObjMakePoConst0(p,pObj_00);
    iVar1 = Gia_ObjFaninLit0p(p,pObj_00);
    if (iVar1 != 0) {
      __assert_fail("Gia_ObjFaninLit0p(p, pObj) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcChain.c"
                    ,0x11c,"Gia_Man_t *Bmc_ChainCleanup(Gia_Man_t *, Vec_Int_t *)");
    }
    pObj._4_4_ = pObj._4_4_ + 1;
  }
  __assert_fail("Gia_ObjFaninLit0p(p, pObj) != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcChain.c"
                ,0x11a,"Gia_Man_t *Bmc_ChainCleanup(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Bmc_ChainCleanup( Gia_Man_t * p, Vec_Int_t * vOutputs )
{
    int i, iOut;
    Vec_IntForEachEntry( vOutputs, iOut, i )
    {
        Gia_Obj_t * pObj = Gia_ManPo( p, iOut );
        assert( Gia_ObjFaninLit0p(p, pObj) != 0 );
        Gia_ObjMakePoConst0( p, pObj );
        assert( Gia_ObjFaninLit0p(p, pObj) == 0 );
    }
    return Gia_ManCleanup( p );
}